

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUI.c
# Opt level: O3

void redrawUnit(WINDOW *body,Inmate *inmate,Path *path,float oldPosition)

{
  char cVar1;
  int iVar2;
  int iVar3;
  TileNode *pTVar4;
  float fVar5;
  
  fVar5 = ((float)inmate->currentHealth / (float)inmate->maxHealth) * 100.0;
  pTVar4 = path->first;
  init_pair(1,7,0);
  init_pair(10,10,0);
  init_pair(0xb,0xb,0);
  init_pair(9,9,0);
  init_pair(5,5,0);
  for (; oldPosition < (float)pTVar4->location; pTVar4 = pTVar4->next) {
  }
  cVar1 = pTVar4->type;
  wbkgd(body,0x100);
  iVar3 = 0xa00;
  if ((fVar5 <= 75.0) && (iVar3 = 0xb00, fVar5 <= 50.0)) {
    iVar3 = (uint)(25.0 < fVar5) * 0x400 + 0x500;
  }
  wbkgd(body,0x100);
  getCoordinate::coordinates[0] = ((int)oldPosition + -1) / 0x48;
  getCoordinate::coordinates[1] = (int)oldPosition + getCoordinate::coordinates[0] * -0x48 + 1;
  iVar2 = wmove(body);
  if (iVar2 != -1) {
    waddch(body,(int)cVar1);
  }
  getCoordinate::coordinates[0] = ((int)inmate->position + -1) / 0x48;
  getCoordinate::coordinates[1] = (int)inmate->position + getCoordinate::coordinates[0] * -0x48 + 1;
  wbkgd(body,iVar3);
  iVar3 = wmove(body,getCoordinate::coordinates[0],getCoordinate::coordinates[1]);
  if (iVar3 != -1) {
    waddch(body,(int)inmate->type);
  }
  wbkgd(body,0x100);
  return;
}

Assistant:

void redrawUnit(WINDOW *body, struct Inmate *inmate, struct Path *path,
    float oldPosition) {
    int *currentCoordinates = malloc(sizeof(int) * 2);
    int *newCoordinates = malloc(sizeof(int) * 2);
    float hp, mhp, php;
    int setColor = GREEN;
    hp = (float) inmate->currentHealth;
    mhp = (float) inmate->maxHealth;
    php = (hp / mhp) * 100;
    struct TileNode *tNode = path->first;
    char type = tNode->type;

    init_pair(1, COLOR_WHITE, COLOR_BLACK);
    init_pair(GREEN, GREEN, COLOR_BLACK);
    init_pair(YELLOW, YELLOW, COLOR_BLACK);
    init_pair(RED, RED, COLOR_BLACK);
    init_pair(PURPLE, PURPLE, COLOR_BLACK);

    while (oldPosition < ((float) tNode->location)) {
        tNode = tNode->next;
    }
    type = tNode->type;

    wbkgd(body, COLOR_PAIR(1));

    if (php > 75.0) {
        setColor = GREEN;
    } else if (php > 50.0) {
        setColor = YELLOW;
    } else if (php > 25.0) {
        setColor = RED;
    } else {
        setColor = PURPLE;
    }

#ifndef _DEBUG
    /* Print movement debug information if the debug macro has been set */
    mvwprintw(
        body, 0, 1, "%d %d %f %f, %d, %d, %f, %f",
        newCoordinates[0], newCoordinates[1],
        inmate->position, php, inmate->currentHealth, inmate->maxHealth, hp, mhp
    );
#endif

    wbkgd(body, COLOR_PAIR(1));

    currentCoordinates = getCoordinate(oldPosition);
    mvwaddch(body, currentCoordinates[0], currentCoordinates[1], type);
    newCoordinates = getCoordinate(inmate->position);
    wbkgd(body, COLOR_PAIR(setColor));
    mvwaddch(body, newCoordinates[0], newCoordinates[1], inmate->type);
    wbkgd(body, COLOR_PAIR (1));
}